

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_core.c
# Opt level: O3

int asterism_core_prepare(asterism_s *as)

{
  asterism_str s;
  asterism_str s_00;
  asterism_str s_01;
  char **ppcVar1;
  int iVar2;
  uv_loop_t *puVar3;
  check_timer_s *pcVar4;
  uint uVar5;
  asterism_slist *paVar6;
  asterism_str aVar7;
  uint port;
  asterism_str host;
  asterism_host_type host_type;
  asterism_str scheme;
  uint local_5c;
  asterism_str local_58;
  asterism_host_type local_44;
  asterism_str local_40;
  char *ip;
  
  puVar3 = uv_loop_new();
  as->loop = puVar3;
  if (as->idle_timeout == 0) {
    as->idle_timeout = 0x3c;
  }
  if (as->reconnect_delay == 0) {
    as->reconnect_delay = 10000;
  }
  if (as->heartbeart_interval == 0) {
    as->heartbeart_interval = 30000;
  }
  _global_proto_ping.len = 0x400;
  _global_proto_pong.len = 0x400;
  as->conns_queue[0] = as->conns_queue;
  as->conns_queue[1] = as->conns_queue;
  paVar6 = as->inner_bind_addrs;
  if (paVar6 != (asterism_slist *)0x0) {
    do {
      ppcVar1 = &paVar6->data;
      paVar6 = paVar6->next;
      local_40.len = 0;
      local_58.len = 0;
      iVar2 = asterism_parse_address(*ppcVar1,&local_40,&local_58,&local_5c,&local_44);
      if (iVar2 != 0) {
        return 5;
      }
      iVar2 = asterism_str_empty(&local_40);
      if (iVar2 != 0) {
        return 7;
      }
      iVar2 = asterism_vcasecmp(&local_40,"http");
      if (iVar2 == 0) {
        aVar7.len = local_58.len;
        aVar7.p = local_58.p;
        aVar7 = asterism_strdup_nul(aVar7);
        ip = aVar7.p;
        iVar2 = asterism_inner_http_init(as,ip,&local_5c);
      }
      else {
        iVar2 = asterism_vcasecmp(&local_40,"socks5");
        if (iVar2 != 0) {
          return 7;
        }
        s.len = local_58.len;
        s.p = local_58.p;
        aVar7 = asterism_strdup_nul(s);
        ip = aVar7.p;
        iVar2 = asterism_inner_socks5_init(as,ip,&local_5c);
      }
      free(ip);
      if (iVar2 != 0) {
        return iVar2;
      }
    } while (paVar6 != (asterism_slist *)0x0);
  }
  if (as->outer_bind_addr == (char *)0x0) {
LAB_0010b861:
    if (as->connect_addr != (char *)0x0) {
      local_40.len = 0;
      local_58.len = 0;
      if (as->username == (char *)0x0) {
        return 6;
      }
      if (as->password == (char *)0x0) {
        return 6;
      }
      iVar2 = asterism_parse_address(as->connect_addr,&local_40,&local_58,&local_5c,&local_44);
      if (iVar2 != 0) {
        return 5;
      }
      iVar2 = asterism_vcasecmp(&local_40,"tcp");
      if ((iVar2 != 0) && (iVar2 = asterism_str_empty(&local_40), iVar2 == 0)) goto LAB_0010b98c;
      s_01.len = local_58.len;
      s_01.p = local_58.p;
      aVar7 = asterism_strdup_nul(s_01);
      iVar2 = asterism_connector_tcp_init(as,aVar7.p,local_5c);
      free(aVar7.p);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    pcVar4 = (check_timer_s *)calloc(1,0xa8);
    as->check_timer = pcVar4;
    (pcVar4->timer).data = pcVar4;
    pcVar4->close = check_timer_close;
    pcVar4->as = as;
    iVar2 = uv_timer_init(as->loop,&pcVar4->timer);
    uVar5 = 1;
    if (iVar2 == 0) {
      iVar2 = uv_timer_start(&as->check_timer->timer,check_timer_cb,1000,1000);
      uVar5 = (uint)(iVar2 != 0);
    }
  }
  else {
    local_40.len = 0;
    local_58.len = 0;
    iVar2 = asterism_parse_address(as->outer_bind_addr,&local_40,&local_58,&local_5c,&local_44);
    if (iVar2 != 0) {
      return 5;
    }
    iVar2 = asterism_vcasecmp(&local_40,"tcp");
    if ((iVar2 == 0) || (iVar2 = asterism_str_empty(&local_40), iVar2 != 0)) {
      s_00.len = local_58.len;
      s_00.p = local_58.p;
      aVar7 = asterism_strdup_nul(s_00);
      iVar2 = asterism_outer_tcp_init(as,aVar7.p,&local_5c);
      free(aVar7.p);
      if (iVar2 != 0) {
        return iVar2;
      }
      goto LAB_0010b861;
    }
LAB_0010b98c:
    uVar5 = 7;
  }
  return uVar5;
}

Assistant:

int asterism_core_prepare(struct asterism_s *as)
{
    int ret = ASTERISM_E_OK;
    as->loop = uv_loop_new();
    if (as->idle_timeout == 0) {
        as->idle_timeout = ASTERISM_CONNECTION_MAX_IDLE_COUNT;
    }
    if (as->reconnect_delay == 0) {
        as->reconnect_delay = ASTERISM_RECONNECT_DELAY;
    }
    if (as->heartbeart_interval == 0) {
        as->heartbeart_interval = ASTERISM_HEARTBEART_INTERVAL;
    }
    _global_proto_ping.len = htons(sizeof(_global_proto_ping));
    _global_proto_pong.len = htons(sizeof(_global_proto_pong));

    QUEUE_INIT(&as->conns_queue);

    struct asterism_slist *next;
    struct asterism_slist *item;
    if (as->inner_bind_addrs) {
        item = as->inner_bind_addrs;
        do
        {
            next = item->next;
            char *inner_bind_addr = item->data;
            struct asterism_str scheme;
            struct asterism_str host;
            unsigned int port;
            asterism_host_type host_type;
            scheme.len = 0;
            host.len = 0;
            int ret_addr = asterism_parse_address(inner_bind_addr, &scheme, &host, &port, &host_type);
            if (ret_addr)
            {
                ret = ASTERISM_E_ADDRESS_PARSE_ERROR;
                goto cleanup;
            }
            if (asterism_str_empty(&scheme))
            {
                ret = ASTERISM_E_PROTOCOL_NOT_SUPPORT;
                goto cleanup;
            }
            if (asterism_vcasecmp(&scheme, "http") == 0)
            {
                struct asterism_str __host = asterism_strdup_nul(host);
                ret = asterism_inner_http_init(as, __host.p, &port);
                AS_FREE((char *)__host.p);
                if (ret)
                    goto cleanup;
            }
            else if (asterism_vcasecmp(&scheme, "socks5") == 0)
            {
                struct asterism_str __host = asterism_strdup_nul(host);
                ret = asterism_inner_socks5_init(as, __host.p, &port);
                AS_FREE((char *)__host.p);
                if (ret)
                    goto cleanup;
            }
            else
            {
                ret = ASTERISM_E_PROTOCOL_NOT_SUPPORT;
                goto cleanup;
            }
            item = next;
        } while (next);
    }

    if (as->outer_bind_addr)
    {
        struct asterism_str scheme;
        struct asterism_str host;
        unsigned int port;
        asterism_host_type host_type;
        scheme.len = 0;
        host.len = 0;
        int ret_addr = asterism_parse_address(as->outer_bind_addr, &scheme, &host, &port, &host_type);
        if (ret_addr)
        {
            ret = ASTERISM_E_ADDRESS_PARSE_ERROR;
            goto cleanup;
        }
        if (asterism_vcasecmp(&scheme, "tcp") && !asterism_str_empty(&scheme))
        {
            ret = ASTERISM_E_PROTOCOL_NOT_SUPPORT;
            goto cleanup;
        }
        struct asterism_str __host = asterism_strdup_nul(host);
        ret = asterism_outer_tcp_init(as, __host.p, &port);
        AS_FREE((char *)__host.p);
        if (ret)
            goto cleanup;
    }
    if (as->connect_addr)
    {
        struct asterism_str scheme;
        struct asterism_str host;
        unsigned int port;
        asterism_host_type host_type;
        scheme.len = 0;
        host.len = 0;
        if (!as->username || !as->password)
        {
            ret = ASTERISM_E_USERPASS_EMPTY;
            goto cleanup;
        }
        int ret_addr = asterism_parse_address(as->connect_addr, &scheme, &host, &port, &host_type);
        if (ret_addr)
        {
            ret = ASTERISM_E_ADDRESS_PARSE_ERROR;
            goto cleanup;
        }
        if (asterism_vcasecmp(&scheme, "tcp") && !asterism_str_empty(&scheme))
        {
            ret = ASTERISM_E_PROTOCOL_NOT_SUPPORT;
            goto cleanup;
        }
        struct asterism_str __host = asterism_strdup_nul(host);
        ret = asterism_connector_tcp_init(as, __host.p, port);
        AS_FREE((char *)__host.p);
        if (ret)
            goto cleanup;
    }

    as->check_timer = AS_ZMALLOC(struct check_timer_s);
    ASTERISM_HANDLE_INIT(as->check_timer, timer, check_timer_close);
    as->check_timer->as = as;
    ret = uv_timer_init(as->loop, &as->check_timer->timer);
    if (ret != 0)
    {
        ret = ASTERISM_E_FAILED;
        goto cleanup;
    }
    ret = uv_timer_start(&as->check_timer->timer, check_timer_cb, 1 * 1000, 1 * 1000);
    if (ret != 0)
    {
        ret = ASTERISM_E_FAILED;
        goto cleanup;
    }
cleanup:
    return ret;
}